

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_key.cpp
# Opt level: O0

PubkeyDataStruct *
cfd::js::api::KeyStructApi::GetPubkeyFromPrivkey
          (PubkeyDataStruct *__return_storage_ptr__,GetPubkeyFromPrivkeyRequestStruct *request)

{
  GetPubkeyFromPrivkeyRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetPubkeyFromPrivkeyRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetPubkeyFromPrivkeyRequestStruct *request_local;
  PubkeyDataStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  PubkeyDataStruct::PubkeyDataStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::
  function<cfd::js::api::PubkeyDataStruct(cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_const&)>::
  function<cfd::js::api::KeyStructApi::GetPubkeyFromPrivkey(cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::PubkeyDataStruct(cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"GetPubkeyFromPrivkey",&local_129);
  ExecuteStructApi<cfd::js::api::GetPubkeyFromPrivkeyRequestStruct,cfd::js::api::PubkeyDataStruct>
            ((PubkeyDataStruct *)(local_108 + 0x20),(api *)this,
             (GetPubkeyFromPrivkeyRequestStruct *)local_108,&local_128,in_R8);
  PubkeyDataStruct::operator=(__return_storage_ptr__,(PubkeyDataStruct *)(local_108 + 0x20));
  PubkeyDataStruct::~PubkeyDataStruct((PubkeyDataStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_&)>
  ::~function((function<cfd::js::api::PubkeyDataStruct_(const_cfd::js::api::GetPubkeyFromPrivkeyRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

PubkeyDataStruct KeyStructApi::GetPubkeyFromPrivkey(
    const GetPubkeyFromPrivkeyRequestStruct& request) {
  auto call_func = [](const GetPubkeyFromPrivkeyRequestStruct& request)
      -> PubkeyDataStruct {
    PubkeyDataStruct response;

    KeyApi api;
    response.pubkey =
        api.GetPubkeyFromPrivkey(request.privkey, request.is_compressed);
    return response;
  };

  PubkeyDataStruct result;
  result =
      ExecuteStructApi<GetPubkeyFromPrivkeyRequestStruct, PubkeyDataStruct>(
          request, call_func, std::string(__FUNCTION__));
  return result;
}